

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absGla.c
# Opt level: O1

void Ga2_ManReportMemory(Ga2_Man_t *p)

{
  int iVar1;
  int iVar2;
  Vec_Int_t *pVVar3;
  Vec_Ptr_t *pVVar4;
  bool bVar5;
  bool bVar6;
  long lVar7;
  int iVar8;
  Rnm_Man_t *p_00;
  double dVar9;
  double dVar10;
  double dVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  double dVar14;
  double dVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  double dVar19;
  double dVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  double dVar23;
  undefined1 auVar24 [16];
  double dVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  double dVar29;
  undefined1 auVar30 [16];
  double dVar31;
  double dVar32;
  
  pVVar3 = p->pGia->vMapping;
  dVar14 = 0.0;
  if (pVVar3 != (Vec_Int_t *)0x0) {
    iVar1 = pVVar3->nCap;
    auVar12._8_4_ = iVar1 >> 0x1f;
    auVar12._0_8_ = (long)iVar1;
    auVar12._12_4_ = 0x45300000;
    dVar14 = ((auVar12._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,iVar1) - 4503599627370496.0)) * 4.0 + 16.0;
  }
  iVar1 = p->pGia->nObjsAlloc;
  dVar9 = sat_solver2_memory(p->pSat,1);
  dVar10 = sat_solver2_memory_proof(p->pSat);
  pVVar4 = p->vId2Lit;
  dVar29 = 0.0;
  if (pVVar4 != (Vec_Ptr_t *)0x0) {
    iVar8 = pVVar4->nCap;
    auVar13._8_4_ = iVar8 >> 0x1f;
    auVar13._0_8_ = (long)iVar8;
    auVar13._12_4_ = 0x45300000;
    dVar29 = ((auVar13._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,iVar8) - 4503599627370496.0)) * 8.0 + 16.0;
    if (0 < (long)pVVar4->nSize) {
      lVar7 = 0;
      do {
        if ((int *)pVVar4->pArray[lVar7] != (int *)0x0) {
          iVar8 = *pVVar4->pArray[lVar7];
          auVar24._8_4_ = iVar8 >> 0x1f;
          auVar24._0_8_ = (long)iVar8;
          auVar24._12_4_ = 0x45300000;
          dVar29 = dVar29 + ((auVar24._8_8_ - 1.9342813113834067e+25) +
                            ((double)CONCAT44(0x43300000,iVar8) - 4503599627370496.0)) * 4.0 + 16.0;
        }
        lVar7 = lVar7 + 1;
      } while (pVVar4->nSize != lVar7);
    }
  }
  p_00 = p->pRnm;
  dVar11 = Rnm_ManMemoryUsage(p_00);
  iVar8 = (int)p_00;
  pVVar4 = p->vCnfs;
  dVar32 = 0.0;
  dVar31 = 0.0;
  if (pVVar4 != (Vec_Ptr_t *)0x0) {
    iVar2 = pVVar4->nCap;
    auVar16._8_4_ = iVar2 >> 0x1f;
    auVar16._0_8_ = (long)iVar2;
    auVar16._12_4_ = 0x45300000;
    dVar31 = ((auVar16._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,iVar2) - 4503599627370496.0)) * 8.0 + 16.0;
    if (0 < (long)pVVar4->nSize) {
      lVar7 = 0;
      do {
        if ((int *)pVVar4->pArray[lVar7] != (int *)0x0) {
          iVar2 = *pVVar4->pArray[lVar7];
          auVar26._8_4_ = iVar2 >> 0x1f;
          auVar26._0_8_ = (long)iVar2;
          auVar26._12_4_ = 0x45300000;
          dVar31 = dVar31 + ((auVar26._8_8_ - 1.9342813113834067e+25) +
                            ((double)CONCAT44(0x43300000,iVar2) - 4503599627370496.0)) * 4.0 + 16.0;
        }
        lVar7 = lVar7 + 1;
      } while (pVVar4->nSize != lVar7);
    }
  }
  if (p->vIds != (Vec_Int_t *)0x0) {
    iVar2 = p->vIds->nCap;
    auVar17._8_4_ = iVar2 >> 0x1f;
    auVar17._0_8_ = (long)iVar2;
    auVar17._12_4_ = 0x45300000;
    dVar32 = ((auVar17._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,iVar2) - 4503599627370496.0)) * 4.0 + 16.0;
  }
  dVar15 = 0.0;
  dVar19 = 0.0;
  if (p->vProofIds != (Vec_Int_t *)0x0) {
    iVar2 = p->vProofIds->nCap;
    auVar21._8_4_ = iVar2 >> 0x1f;
    auVar21._0_8_ = (long)iVar2;
    auVar21._12_4_ = 0x45300000;
    dVar19 = ((auVar21._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,iVar2) - 4503599627370496.0)) * 4.0 + 16.0;
  }
  if (p->vAbs != (Vec_Int_t *)0x0) {
    iVar2 = p->vAbs->nCap;
    auVar22._8_4_ = iVar2 >> 0x1f;
    auVar22._0_8_ = (long)iVar2;
    auVar22._12_4_ = 0x45300000;
    dVar15 = ((auVar22._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,iVar2) - 4503599627370496.0)) * 4.0 + 16.0;
  }
  dVar20 = 0.0;
  dVar23 = 0.0;
  if (p->vValues != (Vec_Int_t *)0x0) {
    iVar2 = p->vValues->nCap;
    auVar27._8_4_ = iVar2 >> 0x1f;
    auVar27._0_8_ = (long)iVar2;
    auVar27._12_4_ = 0x45300000;
    dVar23 = ((auVar27._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,iVar2) - 4503599627370496.0)) * 4.0 + 16.0;
  }
  if (p->vLits != (Vec_Int_t *)0x0) {
    iVar2 = p->vLits->nCap;
    auVar28._8_4_ = iVar2 >> 0x1f;
    auVar28._0_8_ = (long)iVar2;
    auVar28._12_4_ = 0x45300000;
    dVar20 = ((auVar28._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,iVar2) - 4503599627370496.0)) * 4.0 + 16.0;
  }
  dVar25 = 0.0;
  if (p->vIsopMem != (Vec_Int_t *)0x0) {
    iVar2 = p->vIsopMem->nCap;
    auVar30._8_4_ = iVar2 >> 0x1f;
    auVar30._0_8_ = (long)iVar2;
    auVar30._12_4_ = 0x45300000;
    dVar25 = ((auVar30._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,iVar2) - 4503599627370496.0)) * 4.0 + 16.0;
  }
  lVar7 = (long)p->nTable * 0x18;
  auVar18._8_4_ = (int)((ulong)lVar7 >> 0x20);
  auVar18._0_8_ = lVar7;
  auVar18._12_4_ = 0x45300000;
  dVar14 = (double)iVar1 * 12.0 + dVar14;
  dVar29 = dVar14 + dVar9 + dVar10 + dVar29 + dVar11 +
           (auVar18._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)lVar7) - 4503599627370496.0) +
           dVar31 + 224.0 + dVar32 + dVar19 + dVar15 + dVar23 + dVar20 + dVar25 + 926274.0;
  Abc_Print(iVar8,"%s =","Memory: AIG      ");
  bVar5 = NAN(dVar29);
  bVar6 = dVar29 == 0.0;
  dVar31 = (dVar14 * 100.0) / dVar29;
  if ((bVar6) && (!bVar5)) {
    dVar31 = 0.0;
  }
  dVar32 = (dVar9 * 100.0) / dVar29;
  if ((bVar6) && (!bVar5)) {
    dVar32 = 0.0;
  }
  dVar15 = (dVar10 * 100.0) / dVar29;
  if ((bVar6) && (!bVar5)) {
    dVar15 = 0.0;
  }
  dVar19 = (dVar11 * 100.0) / dVar29;
  if ((bVar6) && (!bVar5)) {
    dVar19 = 0.0;
  }
  dVar20 = (dVar29 * 100.0) / dVar29;
  if ((bVar6) && (!bVar5)) {
    dVar20 = 0.0;
  }
  Abc_Print(iVar8,"%10.3f MB (%6.2f %%)\n",dVar14 * 9.5367431640625e-07,dVar31);
  Abc_Print(iVar8,"%s =","Memory: SAT      ");
  Abc_Print(iVar8,"%10.3f MB (%6.2f %%)\n",dVar9 * 9.5367431640625e-07,dVar32);
  Abc_Print(iVar8,"%s =","Memory: Proof    ");
  Abc_Print(iVar8,"%10.3f MB (%6.2f %%)\n",dVar10 * 9.5367431640625e-07,dVar15);
  Abc_Print(iVar8,"%s =","Memory: Map      ");
  Abc_Print(iVar8,"%10.3f MB (%6.2f %%)\n");
  Abc_Print(iVar8,"%s =","Memory: Refine   ");
  Abc_Print(iVar8,"%10.3f MB (%6.2f %%)\n",dVar11 * 9.5367431640625e-07,dVar19);
  Abc_Print(iVar8,"%s =","Memory: Hash     ");
  Abc_Print(iVar8,"%10.3f MB (%6.2f %%)\n");
  Abc_Print(iVar8,"%s =","Memory: Other    ");
  Abc_Print(iVar8,"%10.3f MB (%6.2f %%)\n");
  Abc_Print(iVar8,"%s =","Memory: TOTAL    ");
  Abc_Print(iVar8,"%10.3f MB (%6.2f %%)\n",dVar29 * 9.5367431640625e-07,dVar20);
  return;
}

Assistant:

void Ga2_ManReportMemory( Ga2_Man_t * p )
{
    double memTot = 0;
    double memAig = 1.0 * p->pGia->nObjsAlloc * sizeof(Gia_Obj_t) + Vec_IntMemory(p->pGia->vMapping);
    double memSat = sat_solver2_memory( p->pSat, 1 );
    double memPro = sat_solver2_memory_proof( p->pSat );
    double memMap = Vec_VecMemoryInt( (Vec_Vec_t *)p->vId2Lit );
    double memRef = Rnm_ManMemoryUsage( p->pRnm );
    double memHash= sizeof(int) * 6 * p->nTable;
    double memOth = sizeof(Ga2_Man_t);
    memOth += Vec_VecMemoryInt( (Vec_Vec_t *)p->vCnfs );
    memOth += Vec_IntMemory( p->vIds );
    memOth += Vec_IntMemory( p->vProofIds );
    memOth += Vec_IntMemory( p->vAbs );
    memOth += Vec_IntMemory( p->vValues );
    memOth += Vec_IntMemory( p->vLits );
    memOth += Vec_IntMemory( p->vIsopMem );
    memOth += 336450 + (sizeof(char) + sizeof(char*)) * 65536;
    memTot = memAig + memSat + memPro + memMap + memRef + memHash + memOth;
    ABC_PRMP( "Memory: AIG      ", memAig, memTot );
    ABC_PRMP( "Memory: SAT      ", memSat, memTot );
    ABC_PRMP( "Memory: Proof    ", memPro, memTot );
    ABC_PRMP( "Memory: Map      ", memMap, memTot );
    ABC_PRMP( "Memory: Refine   ", memRef, memTot );
    ABC_PRMP( "Memory: Hash     ", memHash,memTot );
    ABC_PRMP( "Memory: Other    ", memOth, memTot );
    ABC_PRMP( "Memory: TOTAL    ", memTot, memTot );
}